

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_multiple_outputs0(APITests *this)

{
  initializer_list<int> __l;
  long in_RDI;
  vector<int,_std::allocator<int>_> channels;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  undefined4 uVar1;
  undefined4 uVar2;
  vector<int,_std::allocator<int>_> *this_00;
  iterator piVar3;
  size_type in_stack_ffffffffffffffe0;
  
  GPIO::setmode(BOARD);
  uVar1 = *(undefined4 *)(in_RDI + 0x20);
  uVar2 = *(undefined4 *)(in_RDI + 0x28);
  this_00 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8;
  piVar3 = (iterator)0x2;
  std::allocator<int>::allocator((allocator<int> *)0x14009f);
  __l._M_len = in_stack_ffffffffffffffe0;
  __l._M_array = piVar3;
  std::vector<int,_std::allocator<int>_>::vector
            (this_00,__l,(allocator_type *)CONCAT44(uVar2,uVar1));
  std::allocator<int>::~allocator((allocator<int> *)0x1400c4);
  GPIO::setup((vector *)&stack0xffffffffffffffe0,OUT,-1);
  GPIO::output((vector *)&stack0xffffffffffffffe0,1);
  GPIO::output((vector *)&stack0xffffffffffffffe0,0);
  GPIO::cleanup();
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void test_multiple_outputs0()
    {
        GPIO::setmode(GPIO::BOARD);
        std::vector<int> channels = {pin_data.out_a, pin_data.out_b};
        GPIO::setup(channels, GPIO::OUT);
        GPIO::output(channels, GPIO::HIGH);
        GPIO::output(channels, GPIO::LOW);
        GPIO::cleanup();
    }